

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O0

uint64_t helper_pacda_aarch64(CPUARMState_conflict *env,uint64_t x,uint64_t y)

{
  _Bool _Var1;
  int el_00;
  uintptr_t unaff_retaddr;
  int el;
  uint64_t y_local;
  uint64_t x_local;
  CPUARMState_conflict *env_local;
  
  el_00 = arm_current_el(env);
  _Var1 = pauth_key_enabled(env,el_00,0x8000000);
  env_local = (CPUARMState_conflict *)x;
  if (_Var1) {
    pauth_check_trap(env,el_00,unaff_retaddr);
    env_local = (CPUARMState_conflict *)pauth_addpac(env,x,y,&(env->keys).apda,true);
  }
  return (uint64_t)env_local;
}

Assistant:

uint64_t HELPER(pacda)(CPUARMState *env, uint64_t x, uint64_t y)
{
    int el = arm_current_el(env);
    if (!pauth_key_enabled(env, el, SCTLR_EnDA)) {
        return x;
    }
    pauth_check_trap(env, el, GETPC());
    return pauth_addpac(env, x, y, &env->keys.apda, true);
}